

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib539.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  long lVar2;
  void *__ptr;
  long lVar3;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    }
    else {
      iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
      if (((iVar1 != 0) || (iVar1 = curl_easy_setopt(lVar2,0x29,1), iVar1 != 0)) ||
         (iVar1 = curl_easy_setopt(lVar2,0x8a,3), iVar1 != 0)) {
        __ptr = (void *)0x0;
        lVar3 = 0;
LAB_001012aa:
        curl_slist_free_all(lVar3);
        free(__ptr);
        curl_easy_cleanup(lVar2);
        curl_global_cleanup();
        return iVar1;
      }
      curl_easy_perform(lVar2);
      __ptr = (void *)curl_maprintf("%s./",URL);
      if (__ptr != (void *)0x0) {
        lVar3 = curl_slist_append(0,"SYST");
        if (lVar3 != 0) {
          iVar1 = curl_easy_setopt(lVar2,0x2712,__ptr);
          if (((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar2,0x8a,2), iVar1 == 0)) &&
             (iVar1 = curl_easy_setopt(lVar2,0x272c,lVar3), iVar1 == 0)) {
            iVar1 = curl_easy_perform(lVar2);
          }
          goto LAB_001012aa;
        }
        free(__ptr);
      }
      curl_easy_cleanup(lVar2);
    }
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
   CURLcode res;
   CURL *curl;
   char *newURL = NULL;
   struct curl_slist *slist = NULL;

   if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
     fprintf(stderr, "curl_global_init() failed\n");
     return TEST_ERR_MAJOR_BAD;
   }

   curl = curl_easy_init();
   if(!curl) {
     fprintf(stderr, "curl_easy_init() failed\n");
     curl_global_cleanup();
     return TEST_ERR_MAJOR_BAD;
   }

   /*
    * Begin with curl set to use a single CWD to the URL's directory.
    */
   test_setopt(curl, CURLOPT_URL, URL);
   test_setopt(curl, CURLOPT_VERBOSE, 1L);
   test_setopt(curl, CURLOPT_FTP_FILEMETHOD, (long) CURLFTPMETHOD_SINGLECWD);

   res = curl_easy_perform(curl);

   /*
    * Change the FTP_FILEMETHOD option to use full paths rather than a CWD
    * command.  Alter the URL's path a bit, appending a "./".  Use an innocuous
    * QUOTE command, after which curl will CWD to ftp_conn->entrypath and then
    * (on the next call to ftp_statemach_act) find a non-zero ftpconn->dirdepth
    * even though no directories are stored in the ftpconn->dirs array (after a
    * call to freedirs).
    */
   newURL = aprintf("%s./", URL);
   if(newURL == NULL) {
     curl_easy_cleanup(curl);
     curl_global_cleanup();
     return TEST_ERR_MAJOR_BAD;
   }

   slist = curl_slist_append(NULL, "SYST");
   if(slist == NULL) {
     free(newURL);
     curl_easy_cleanup(curl);
     curl_global_cleanup();
     return TEST_ERR_MAJOR_BAD;
   }

   test_setopt(curl, CURLOPT_URL, newURL);
   test_setopt(curl, CURLOPT_FTP_FILEMETHOD, (long) CURLFTPMETHOD_NOCWD);
   test_setopt(curl, CURLOPT_QUOTE, slist);

   res = curl_easy_perform(curl);

test_cleanup:

   curl_slist_free_all(slist);
   free(newURL);
   curl_easy_cleanup(curl);
   curl_global_cleanup();

   return (int)res;
}